

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O2

int jsonquoted(char *in,size_t len,dynbuf *out,_Bool lowercase)

{
  byte bVar1;
  size_t sVar2;
  CURLcode CVar3;
  undefined8 in_RAX;
  byte bVar4;
  char *mem;
  byte *pbVar5;
  size_t sStack_40;
  undefined8 uStack_38;
  
  pbVar5 = (byte *)(in + len);
  sVar2 = 2;
  CVar3 = CURLE_OK;
  uStack_38 = in_RAX;
  do {
    if ((pbVar5 <= in) || (CVar3 != CURLE_OK)) {
      return CVar3;
    }
    bVar1 = *in;
    sStack_40 = sVar2;
    switch(bVar1) {
    case 8:
      mem = "\\b";
      break;
    case 9:
      mem = "\\t";
      break;
    case 10:
      mem = "\\n";
      break;
    case 0xb:
switchD_0011e493_caseD_b:
      if (0x1f < bVar1) {
        bVar4 = bVar1 | 0x20;
        if (!lowercase) {
          bVar4 = bVar1;
        }
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar4 = bVar1;
        }
        uStack_38 = CONCAT17(bVar4,(undefined7)uStack_38);
        mem = (char *)((long)&uStack_38 + 7);
        sStack_40 = 1;
        break;
      }
      CVar3 = curlx_dyn_addf(out,"\\u%04x");
      goto LAB_0011e511;
    case 0xc:
      mem = "\\f";
      break;
    case 0xd:
      mem = "\\r";
      break;
    default:
      if (bVar1 == 0x22) {
        mem = "\\\"";
      }
      else {
        if (bVar1 != 0x5c) goto switchD_0011e493_caseD_b;
        mem = "\\\\";
      }
    }
    CVar3 = curlx_dyn_addn(out,mem,sStack_40);
LAB_0011e511:
    in = (char *)((byte *)in + 1);
  } while( true );
}

Assistant:

int jsonquoted(const char *in, size_t len,
               struct curlx_dynbuf *out, bool lowercase)
{
  const unsigned char *i = (const unsigned char *)in;
  const unsigned char *in_end = &i[len];
  CURLcode result = CURLE_OK;

  for(; (i < in_end) && !result; i++) {
    switch(*i) {
    case '\\':
      result = curlx_dyn_addn(out, "\\\\", 2);
      break;
    case '\"':
      result = curlx_dyn_addn(out, "\\\"", 2);
      break;
    case '\b':
      result = curlx_dyn_addn(out, "\\b", 2);
      break;
    case '\f':
      result = curlx_dyn_addn(out, "\\f", 2);
      break;
    case '\n':
      result = curlx_dyn_addn(out, "\\n", 2);
      break;
    case '\r':
      result = curlx_dyn_addn(out, "\\r", 2);
      break;
    case '\t':
      result = curlx_dyn_addn(out, "\\t", 2);
      break;
    default:
      if(*i < 32)
        result = curlx_dyn_addf(out, "\\u%04x", *i);
      else {
        char o = (char)*i;
        if(lowercase && (o >= 'A' && o <= 'Z'))
          /* do not use tolower() since that is locale specific */
          o |= ('a' - 'A');
        result = curlx_dyn_addn(out, &o, 1);
      }
      break;
    }
  }
  if(result)
    return (int)result;
  return 0;
}